

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_select(void **param_1)

{
  roaring64_bitmap_t *r_00;
  uint64_t i_1;
  uint64_t element;
  uint64_t i;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000070;
  uint64_t *in_stack_00000098;
  uint64_t in_stack_000000a0;
  roaring64_bitmap_t *in_stack_000000a8;
  ulong uVar1;
  char *file;
  char *expression;
  
  r_00 = roaring64_bitmap_create();
  for (expression = (char *)0x0; expression < (char *)0x64; expression = expression + 1) {
    roaring64_bitmap_add(r_00,(uint64_t)expression);
  }
  file = (char *)0x0;
  for (uVar1 = 0; uVar1 < 100; uVar1 = uVar1 + 1) {
    roaring64_bitmap_select(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
    _assert_true((unsigned_long)r_00,expression,file,(int)(uVar1 >> 0x20));
    _assert_int_equal((unsigned_long)r_00,(unsigned_long)expression,file,(int)(uVar1 >> 0x20));
  }
  roaring64_bitmap_select(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  _assert_true((unsigned_long)r_00,expression,file,(int)(uVar1 >> 0x20));
  roaring64_bitmap_free(in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_select) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 1000);
    }
    uint64_t element = 0;
    for (uint64_t i = 0; i < 100; ++i) {
        assert_true(roaring64_bitmap_select(r, i, &element));
        assert_int_equal(element, i * 1000);
    }
    assert_false(roaring64_bitmap_select(r, 100, &element));
    roaring64_bitmap_free(r);
}